

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

void __thiscall fmcalc::init_policytc(fmcalc *this,int maxRunLevel)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference f_00;
  __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_> local_60
  ;
  __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_> local_58
  ;
  iterator iter;
  int i;
  fm_policyTC f;
  undefined1 local_30 [8];
  vector<fm_policyTC,_std::allocator<fm_policyTC>_> p;
  int maxRunLevel_local;
  fmcalc *this_local;
  
  if (maxRunLevel != -1) {
    this->maxRunLevel_ = maxRunLevel;
  }
  p.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = maxRunLevel;
  std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::vector
            ((vector<fm_policyTC,_std::allocator<fm_policyTC>_> *)local_30);
  parse_policytc(this,(vector<fm_policyTC,_std::allocator<fm_policyTC>_> *)local_30);
  iter._M_current._4_4_ = 0;
  iter._M_current._0_4_ = 1;
  while( true ) {
    iVar1 = (int)iter._M_current;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->level_to_maxagg_id_,0);
    if (*pvVar3 < iVar1) break;
    addtcrow(this,(fm_policyTC *)((long)&iter._M_current + 4));
    iter._M_current._0_4_ = (int)iter._M_current + 1;
  }
  local_58._M_current =
       (fm_policyTC *)
       std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::begin
                 ((vector<fm_policyTC,_std::allocator<fm_policyTC>_> *)local_30);
  while( true ) {
    local_60._M_current =
         (fm_policyTC *)
         std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::end
                   ((vector<fm_policyTC,_std::allocator<fm_policyTC>_> *)local_30);
    bVar2 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar2) break;
    f_00 = __gnu_cxx::
           __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
           ::operator*(&local_58);
    addtcrow(this,f_00);
    __gnu_cxx::
    __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>::
    operator++(&local_58,0);
  }
  std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::~vector
            ((vector<fm_policyTC,_std::allocator<fm_policyTC>_> *)local_30);
  return;
}

Assistant:

void fmcalc::init_policytc(int maxRunLevel)
{
	if (maxRunLevel != -1) maxRunLevel_ = maxRunLevel;

	std::vector< fm_policyTC> p;
	parse_policytc(p);

	fm_policyTC f;
	f.layer_id = 1;
	f.level_id = 0;
	f.profile_id = -1;
	for (int i = 1; i <= level_to_maxagg_id_[0]; i++) {		
		f.agg_id = i;		
		addtcrow(f);
	}


	auto iter = p.begin();
	while (iter != p.end()) {
		addtcrow(*iter);
		iter++;
	}

}